

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O1

uint32_t google::protobuf::internal::FastParseTableSize
                   (size_t num_fields,optional<unsigned_int> end_group_tag)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = 0x20;
  if (((ulong)end_group_tag.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    uVar2 = (num_fields + 1) - (num_fields + 1 >> 1 & 0x5555555555555555);
    uVar3 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
    uVar2 = 0x40;
    uVar4 = num_fields + 1;
    if (uVar4 != 0) {
      uVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x3f;
    }
    uVar4 = (ulong)(0x3f - (int)uVar2);
    if ((char)(((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) != '\x01') {
      uVar4 = 0x40 - uVar2;
    }
    uVar1 = 0x20;
    if (uVar4 < 5) {
      uVar1 = (uint32_t)(1L << ((byte)uVar4 & 0x3f));
    }
  }
  return uVar1;
}

Assistant:

uint32_t FastParseTableSize(size_t num_fields,
                            absl::optional<uint32_t> end_group_tag) {
  return end_group_tag.has_value()
             ? TcParseTableBase::kMaxFastFields
             : std::max(size_t{1}, std::min(TcParseTableBase::kMaxFastFields,
                                            absl::bit_ceil(num_fields + 1)));
}